

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_start.c
# Opt level: O3

void start(int thread)

{
  pthread_cond_t *ppVar1;
  uint uVar2;
  pthread_t __th;
  int iVar3;
  int iVar4;
  int *piVar5;
  void *pvVar6;
  skynet_monitor *psVar7;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  void *__arg;
  ulong uVar8;
  ulong uVar9;
  __start_routine *__start_routine;
  pthread_cond_t *__cond;
  pthread_t *ppVar10;
  pthread_t *arg;
  pthread_t *ppVar11;
  long lVar12;
  void *unaff_R15;
  ulong auStack_a0 [5];
  pthread_t apStack_78 [3];
  pthread_cond_t *local_60 [2];
  ulong local_50;
  int *local_48;
  ulong local_40;
  pthread_t *local_38;
  
  local_50 = (ulong)(thread + 3);
  lVar12 = -(local_50 * 8 + 0xf & 0xfffffffffffffff0);
  ppVar10 = (pthread_t *)((long)apStack_78 + lVar12 + 0x10);
  *(undefined8 *)((long)apStack_78 + lVar12 + 8) = 0x11253a;
  piVar5 = (int *)calloc(1,0x70);
  *piVar5 = thread;
  *(undefined8 *)((long)apStack_78 + lVar12 + 8) = 0x112550;
  pvVar6 = malloc((long)thread * 8);
  *(void **)(piVar5 + 2) = pvVar6;
  uVar9 = (ulong)(uint)thread;
  local_40 = (ulong)(uint)thread;
  if (0 < thread) {
    uVar8 = 0;
    do {
      *(undefined8 *)((long)apStack_78 + lVar12 + 8) = 0x11256c;
      psVar7 = skynet_monitor_new();
      *(skynet_monitor **)((long)pvVar6 + uVar8 * 8) = psVar7;
      uVar8 = uVar8 + 1;
      unaff_R15 = pvVar6;
    } while (uVar9 != uVar8);
  }
  ppVar1 = (pthread_cond_t *)(piVar5 + 0x10);
  __start_routine = (__start_routine *)0x0;
  *(undefined8 *)((long)apStack_78 + lVar12 + 8) = 0x112587;
  __cond = ppVar1;
  iVar3 = pthread_mutex_init((pthread_mutex_t *)ppVar1,(pthread_mutexattr_t *)0x0);
  if (iVar3 == 0) {
    __cond = (pthread_cond_t *)(piVar5 + 4);
    __start_routine = (__start_routine *)0x0;
    local_60[0] = ppVar1;
    local_60[1] = __cond;
    *(undefined8 *)((long)apStack_78 + lVar12 + 8) = 0x1125a3;
    iVar3 = pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
    if (iVar3 == 0) {
      *(undefined8 *)((long)apStack_78 + lVar12 + 8) = 0x1125bd;
      create_thread(ppVar10,thread_monitor,piVar5);
      *(undefined8 *)((long)apStack_78 + lVar12 + 8) = 0x1125d0;
      create_thread((pthread_t *)((long)local_60 + lVar12),thread_timer,piVar5);
      local_48 = piVar5;
      local_38 = ppVar10;
      *(undefined8 *)((long)apStack_78 + lVar12 + 8) = 0x1125eb;
      create_thread((pthread_t *)((long)local_60 + lVar12 + 8),thread_socket,piVar5);
      ppVar10 = ppVar10 + uVar9 * -2;
      if (0 < (int)local_40) {
        ppVar11 = local_38 + 3;
        piVar5 = start::weight;
        uVar8 = 0;
        arg = ppVar10;
        do {
          *arg = (pthread_t)local_48;
          *(int *)(arg + 1) = (int)uVar8;
          iVar3 = 0;
          if (uVar8 < 0x20) {
            iVar3 = *piVar5;
          }
          *(int *)((long)arg + 0xc) = iVar3;
          ppVar10[-1] = 0x112644;
          create_thread(ppVar11,thread_worker,arg);
          uVar8 = uVar8 + 1;
          piVar5 = piVar5 + 1;
          arg = arg + 2;
          ppVar11 = ppVar11 + 1;
        } while (uVar9 != uVar8);
      }
      ppVar11 = local_38;
      if (-3 < (int)local_40) {
        uVar9 = 1;
        if (1 < (int)local_50) {
          uVar9 = local_50 & 0xffffffff;
        }
        uVar8 = 0;
        do {
          __th = ppVar11[uVar8];
          ppVar10[-1] = 0x11267f;
          pthread_join(__th,(void **)0x0);
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      piVar5 = local_48;
      iVar3 = *local_48;
      if (0 < (long)iVar3) {
        lVar12 = 0;
        do {
          psVar7 = *(skynet_monitor **)(*(long *)(piVar5 + 2) + lVar12 * 8);
          ppVar10[-1] = 0x1126a3;
          skynet_monitor_delete(psVar7);
          lVar12 = lVar12 + 1;
        } while (iVar3 != lVar12);
      }
      ppVar1 = local_60[0];
      ppVar10[-1] = 0x1126b4;
      pthread_mutex_destroy((pthread_mutex_t *)ppVar1);
      ppVar1 = local_60[1];
      ppVar10[-1] = 0x1126bd;
      pthread_cond_destroy(ppVar1);
      pvVar6 = *(void **)(piVar5 + 2);
      ppVar10[-1] = 0x1126c6;
      free(pvVar6);
      ppVar10[-1] = 0x1126ce;
      free(piVar5);
      return;
    }
  }
  else {
    *(undefined8 *)((long)apStack_78 + lVar12 + 8) = 0x1126e2;
    start_cold_1();
  }
  *(code **)((long)apStack_78 + lVar12 + 8) = create_thread;
  start_cold_2();
  *(undefined8 *)((long)apStack_78 + lVar12 + 8) = extraout_RAX;
  *(undefined8 *)((long)apStack_78 + lVar12) = 0x1126f5;
  iVar3 = pthread_create((pthread_t *)&__cond->__align,(pthread_attr_t *)0x0,__start_routine,__arg);
  if (iVar3 == 0) {
    return;
  }
  *(code **)((long)apStack_78 + lVar12) = thread_monitor;
  create_thread_cold_1();
  *(undefined1 **)((long)apStack_78 + lVar12) = &stack0xfffffffffffffff8;
  *(void **)((long)auStack_a0 + lVar12 + 0x20) = unaff_R15;
  *(ulong *)((long)auStack_a0 + lVar12 + 0x18) = uVar9;
  *(pthread_cond_t **)((long)auStack_a0 + lVar12 + 0x10) = ppVar1;
  *(undefined8 *)((long)auStack_a0 + lVar12 + 8) = extraout_RAX_00;
  uVar2 = (__cond->__data).__lock;
  *(undefined8 *)((long)auStack_a0 + lVar12) = 0x112717;
  skynet_initthread(4);
  do {
    *(undefined8 *)((long)auStack_a0 + lVar12) = 0x11271e;
    iVar3 = skynet_context_total();
    if (iVar3 == 0) {
      return;
    }
    if (0 < (int)uVar2) {
      uVar9 = 0;
      do {
        psVar7 = *(skynet_monitor **)((__cond->__data).__total_seq + uVar9 * 8);
        *(undefined8 *)((long)auStack_a0 + lVar12) = 0x112737;
        skynet_monitor_check(psVar7);
        uVar9 = uVar9 + 1;
      } while (uVar2 != uVar9);
    }
    iVar3 = 5;
    do {
      *(undefined8 *)((long)auStack_a0 + lVar12) = 0x11274b;
      iVar4 = skynet_context_total();
      if (iVar4 == 0) break;
      *(undefined8 *)((long)auStack_a0 + lVar12) = 0x112759;
      sleep(1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  } while( true );
}

Assistant:

static void
start(int thread) {
	pthread_t pid[thread+3];

	struct monitor *m = skynet_malloc(sizeof(*m));
	memset(m, 0, sizeof(*m));
	m->count = thread;
	m->sleep = 0;

	m->m = skynet_malloc(thread * sizeof(struct skynet_monitor *));
	int i;
	for (i=0;i<thread;i++) {
		m->m[i] = skynet_monitor_new();
	}
	if (pthread_mutex_init(&m->mutex, NULL)) {
		fprintf(stderr, "Init mutex error");
		exit(1);
	}
	if (pthread_cond_init(&m->cond, NULL)) {
		fprintf(stderr, "Init cond error");
		exit(1);
	}

	create_thread(&pid[0], thread_monitor, m);
	create_thread(&pid[1], thread_timer, m);
	create_thread(&pid[2], thread_socket, m);

	static int weight[] = { 
		-1, -1, -1, -1, 0, 0, 0, 0,
		1, 1, 1, 1, 1, 1, 1, 1, 
		2, 2, 2, 2, 2, 2, 2, 2, 
		3, 3, 3, 3, 3, 3, 3, 3, };
	struct worker_parm wp[thread];
	for (i=0;i<thread;i++) {
		wp[i].m = m;
		wp[i].id = i;
		if (i < sizeof(weight)/sizeof(weight[0])) {
			wp[i].weight= weight[i];
		} else {
			wp[i].weight = 0;
		}
		create_thread(&pid[i+3], thread_worker, &wp[i]);
	}

	for (i=0;i<thread+3;i++) {
		pthread_join(pid[i], NULL); 
	}

	free_monitor(m);
}